

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicScalableKReach.cpp
# Opt level: O3

void __thiscall
DynamicScalableKReach::DynamicPartialIndex::update_cover(DynamicPartialIndex *this,vertex_t v)

{
  Index *this_00;
  bool bVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  degree_t dVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *pvVar8;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *pvVar9;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
  _Var10;
  const_iterator cVar11;
  pointer ppVar12;
  pointer ppVar13;
  vertex_t extraout_EDX;
  ulong uVar14;
  vertex_t vVar15;
  key_type *pkVar16;
  char *this_01;
  DegreeQueue *this_02;
  __hashtable *__h_1;
  _Hash_node_base *p_Var17;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_03;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var18;
  uint uVar19;
  __hashtable *__h;
  allocator_type aStack_a5;
  vertex_t vStack_a4;
  vertex_t vStack_a0;
  uint uStack_9c;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Stack_98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vStack_90;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Stack_78;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Stack_70;
  ulong uStack_68;
  Index *pIStack_60;
  key_type *pkStack_58;
  DynamicPartialIndex *pDStack_50;
  Index *pIStack_48;
  vertex_t local_2c;
  
  local_2c = v;
  dVar5 = Graph::num_vertices(this->graph_);
  if (dVar5 != 0) {
    uVar14 = 0;
    do {
      pkVar16 = &local_2c;
      iVar6 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->succ_)._M_h,&local_2c);
      vVar15 = (vertex_t)pkVar16;
      if (iVar6.
          super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
          ._M_cur == (__node_type *)0x0) {
LAB_0010a2fa:
        this_01 = "_Map_base::at";
        std::__throw_out_of_range("_Map_base::at");
        p_Var18 = &(((DynamicPartialIndex *)this_01)->succ_temp_)._M_h;
        vStack_a4 = vVar15;
        vStack_a0 = extraout_EDX;
        uStack_68 = uVar14;
        pIStack_60 = &this->pred_;
        pkStack_58 = &local_2c;
        pDStack_50 = this;
        pIStack_48 = &this->succ_;
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::clear(p_Var18);
        p_Stack_98 = &(((DynamicPartialIndex *)this_01)->succ_)._M_h;
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::swap(p_Stack_98,p_Var18);
        this_03 = &(((DynamicPartialIndex *)this_01)->pred_temp_)._M_h;
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::clear(this_03);
        this_00 = &((DynamicPartialIndex *)this_01)->pred_;
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::swap(&this_00->_M_h,this_03);
        set_degree((DynamicPartialIndex *)this_01);
        vStack_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((ulong)vStack_90.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
        dVar5 = Graph::num_vertices(((DynamicPartialIndex *)this_01)->graph_);
        if (dVar5 == 0) goto LAB_0010a3cf;
        goto LAB_0010a37f;
      }
      if ((ulong)(*(long *)((long)iVar6.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                  ._M_cur + 0x18) -
                 *(long *)((long)iVar6.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                 ._M_cur + 0x10)) <= uVar14) goto LAB_0010a2e9;
      if (*(char *)(*(long *)((long)iVar6.
                                    super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                    ._M_cur + 0x10) + uVar14) == '?') {
        pkVar16 = &local_2c;
        iVar6 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->pred_)._M_h,&local_2c);
        vVar15 = (vertex_t)pkVar16;
        if (iVar6.
            super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
            ._M_cur == (__node_type *)0x0) goto LAB_0010a2fa;
        if ((ulong)(*(long *)((long)iVar6.
                                    super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                    ._M_cur + 0x18) -
                   *(long *)((long)iVar6.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                   ._M_cur + 0x10)) <= uVar14) goto LAB_0010a2e9;
        if (*(char *)(*(long *)((long)iVar6.
                                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                      ._M_cur + 0x10) + uVar14) != '?') goto LAB_0010a29a;
      }
      else {
LAB_0010a29a:
        puVar2 = (this->degree_->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->degree_->
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar2 >> 2) <= uVar14) {
LAB_0010a2e9:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar14);
        }
        if (puVar2[uVar14] != 0) {
          cover(this,(vertex_t)uVar14);
        }
      }
      uVar14 = uVar14 + 1;
      dVar5 = Graph::num_vertices(this->graph_);
    } while (uVar14 < dVar5);
  }
  return;
  while( true ) {
    std::
    priority_queue<std::pair<unsigned_int,unsigned_int>,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::less<std::pair<unsigned_int,unsigned_int>>>
    ::emplace<unsigned_int&,unsigned_int&>
              ((priority_queue<std::pair<unsigned_int,unsigned_int>,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::less<std::pair<unsigned_int,unsigned_int>>>
                *)((DynamicPartialIndex *)this_01)->quedeg_,
               puVar2 + ((ulong)vStack_90.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start & 0xffffffff),
               (uint *)&vStack_90);
    uVar19 = (int)vStack_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start + 1;
    vStack_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(vStack_90.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,uVar19);
    dVar5 = Graph::num_vertices(((DynamicPartialIndex *)this_01)->graph_);
    if (dVar5 <= uVar19) break;
LAB_0010a37f:
    puVar2 = (((DynamicPartialIndex *)this_01)->degree_->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(((DynamicPartialIndex *)this_01)->degree_->
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar2 >> 2) <=
        ((ulong)vStack_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start & 0xffffffff)) goto LAB_0010ad23;
  }
LAB_0010a3cf:
  this_02 = ((DynamicPartialIndex *)this_01)->quedeg_;
  ppVar12 = (this_02->c).
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar13 = (this_02->c).
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar12 != ppVar13) {
    if ((((DynamicPartialIndex *)this_01)->succ_)._M_h._M_element_count !=
        (ulong)((DynamicPartialIndex *)this_01)->budget_) {
      p_Stack_78 = this_03;
      p_Stack_70 = p_Var18;
      do {
        uVar19 = ppVar12->first;
        uStack_9c = ppVar12->second;
        std::
        priority_queue<std::pair<unsigned_int,_unsigned_int>,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>_>
        ::pop(this_02);
        if (uVar19 != 0) {
          uVar14 = (ulong)uStack_9c;
          puVar2 = (((DynamicPartialIndex *)this_01)->degree_->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(((DynamicPartialIndex *)this_01)->degree_->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_finish - (long)puVar2 >> 2) <= uVar14)
          goto LAB_0010ad23;
          if (puVar2[uVar14] != 0) {
            if (uVar19 == puVar2[uVar14]) {
              bVar1 = ((DynamicPartialIndex *)this_01)->isD2_;
              iVar6 = std::
                      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::find(p_Var18,&uStack_9c);
              if (bVar1 == false) {
                if (iVar6.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                    ._M_cur == (__node_type *)0x0) {
                  vStack_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)CONCAT44(vStack_90.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,uStack_9c);
                  cVar11 = std::
                           _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           ::find(&(((DynamicPartialIndex *)this_01)->parent_->D2_).succ_._M_h,
                                  (key_type *)&vStack_90);
                  if (cVar11.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                      ._M_cur == (__node_type *)0x0) {
                    dVar5 = Graph::num_vertices(((DynamicPartialIndex *)this_01)->graph_);
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                              (&vStack_90,(ulong)dVar5,"?21DynamicScalableKReach",&aStack_a5);
                    pmVar7 = std::__detail::
                             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                           *)p_Stack_98,&uStack_9c);
                    puVar3 = (pmVar7->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start;
                    puVar4 = (pmVar7->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
                    (pmVar7->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start =
                         vStack_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                    (pmVar7->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish =
                         vStack_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                    (pmVar7->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_end_of_storage =
                         vStack_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    vStack_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    vStack_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    vStack_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    if ((puVar3 != (pointer)0x0) &&
                       (operator_delete(puVar3,(long)puVar4 - (long)puVar3),
                       vStack_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                      operator_delete(vStack_90.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)vStack_90.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)vStack_90.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    uVar19 = uStack_9c;
                    pvVar8 = Graph::graph(((DynamicPartialIndex *)this_01)->graph_);
                    iVar6 = std::
                            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            ::find(p_Stack_98,&uStack_9c);
                    if (iVar6.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                        ._M_cur != (__node_type *)0x0) {
                      construct_bfs((DynamicPartialIndex *)this_01,uVar19,pvVar8,
                                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    ((long)iVar6.
                                           super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                           ._M_cur + 0x10));
                      dVar5 = Graph::num_vertices(((DynamicPartialIndex *)this_01)->graph_);
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                                (&vStack_90,(ulong)dVar5,"?21DynamicScalableKReach",&aStack_a5);
                      pmVar7 = std::__detail::
                               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                             *)this_00,&uStack_9c);
                      goto LAB_0010ac0d;
                    }
                  }
                  else {
                    iVar6 = std::
                            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            ::find(&(((DynamicPartialIndex *)this_01)->parent_->D2_).succ_._M_h,
                                   &uStack_9c);
                    if (iVar6.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                        ._M_cur != (__node_type *)0x0) {
                      pmVar7 = std::__detail::
                               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                             *)p_Stack_98,&uStack_9c);
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                                (pmVar7,(long)iVar6.
                                              super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                              ._M_cur + 0x10);
                      for (p_Var17 = (((DynamicPartialIndex *)this_01)->succ_temp_)._M_h.
                                     _M_before_begin._M_nxt; p_Var17 != (_Hash_node_base *)0x0;
                          p_Var17 = p_Var17->_M_nxt) {
                        iVar6 = std::
                                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                ::find(p_Stack_98,&uStack_9c);
                        if (iVar6.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                            ._M_cur == (__node_type *)0x0) goto LAB_0010ad04;
                        uVar19 = *(uint *)&p_Var17[1]._M_nxt;
                        if ((ulong)(*(long *)((long)iVar6.
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                                  ._M_cur + 0x18) -
                                   *(long *)((long)iVar6.
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                                  ._M_cur + 0x10)) <= (ulong)uVar19)
                        goto LAB_0010ad23;
                        if (*(char *)(*(long *)((long)iVar6.
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                                  ._M_cur + 0x10) + (ulong)uVar19) != '?') {
                          pvVar8 = Graph::graph(((DynamicPartialIndex *)this_01)->graph_);
                          iVar6 = std::
                                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                  ::find(p_Stack_98,&uStack_9c);
                          if (iVar6.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                              ._M_cur == (__node_type *)0x0) goto LAB_0010ad04;
                          resume_bfs((DynamicPartialIndex *)this_01,uVar19,pvVar8,
                                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     ((long)iVar6.
                                            super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                            ._M_cur + 0x10));
                        }
                      }
                      pvVar8 = Graph::graph(((DynamicPartialIndex *)this_01)->graph_);
                      pvVar9 = Graph::reverse_graph(((DynamicPartialIndex *)this_01)->graph_);
                      iVar6 = std::
                              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                              ::find(p_Stack_98,&uStack_9c);
                      if (iVar6.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                          ._M_cur != (__node_type *)0x0) {
                        update_remove((DynamicPartialIndex *)this_01,vStack_a4,vStack_a0,pvVar8,
                                      pvVar9,(vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)((long)iVar6.
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                                  ._M_cur + 0x10));
                        iVar6 = std::
                                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                ::find(&(((DynamicPartialIndex *)this_01)->parent_->D2_).pred_._M_h,
                                       &uStack_9c);
                        if (iVar6.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                            ._M_cur != (__node_type *)0x0) {
                          pmVar7 = std::__detail::
                                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                                 *)this_00,&uStack_9c);
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                                    (pmVar7,(long)iVar6.
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                                  ._M_cur + 0x10);
                          for (p_Var17 = (((DynamicPartialIndex *)this_01)->succ_temp_)._M_h.
                                         _M_before_begin._M_nxt; p_Var17 != (_Hash_node_base *)0x0;
                              p_Var17 = p_Var17->_M_nxt) {
                            iVar6 = std::
                                    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                    ::find(&this_00->_M_h,&uStack_9c);
                            if (iVar6.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                ._M_cur == (__node_type *)0x0) goto LAB_0010ad04;
                            uVar19 = *(uint *)&p_Var17[1]._M_nxt;
                            if ((ulong)(*(long *)((long)iVar6.
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                                  ._M_cur + 0x18) -
                                       *(long *)((long)iVar6.
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                                  ._M_cur + 0x10)) <= (ulong)uVar19)
                            goto LAB_0010ad23;
                            if (*(char *)(*(long *)((long)iVar6.
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                                  ._M_cur + 0x10) + (ulong)uVar19) != '?') {
                              pvVar8 = Graph::reverse_graph
                                                 (((DynamicPartialIndex *)this_01)->graph_);
                              iVar6 = std::
                                      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                      ::find(&this_00->_M_h,&uStack_9c);
                              if (iVar6.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                  ._M_cur == (__node_type *)0x0) goto LAB_0010ad04;
                              resume_bfs((DynamicPartialIndex *)this_01,uVar19,pvVar8,
                                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         ((long)iVar6.
                                                super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                                ._M_cur + 0x10));
                            }
                          }
                          goto LAB_0010a9f1;
                        }
                      }
                    }
                  }
                }
                else {
                  iVar6 = std::
                          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          ::find(p_Var18,&uStack_9c);
                  p_Var18 = p_Stack_98;
                  if (iVar6.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                      ._M_cur != (__node_type *)0x0) {
                    pmVar7 = std::__detail::
                             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                           *)p_Stack_98,&uStack_9c);
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                              (pmVar7,(long)iVar6.
                                            super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                            ._M_cur + 0x10);
                    pvVar8 = Graph::graph(((DynamicPartialIndex *)this_01)->graph_);
                    pvVar9 = Graph::reverse_graph(((DynamicPartialIndex *)this_01)->graph_);
                    iVar6 = std::
                            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            ::find(p_Var18,&uStack_9c);
                    if (iVar6.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                        ._M_cur != (__node_type *)0x0) {
                      update_remove((DynamicPartialIndex *)this_01,vStack_a4,vStack_a0,pvVar8,pvVar9
                                    ,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     ((long)iVar6.
                                            super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                            ._M_cur + 0x10));
                      this_03 = p_Stack_78;
                      _Var10._M_cur =
                           (__node_type *)
                           std::
                           _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           ::find(p_Stack_78,&uStack_9c);
joined_r0x0010a5dd:
                      if (_Var10._M_cur != (__node_type *)0x0) {
                        pmVar7 = std::__detail::
                                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                               *)this_00,&uStack_9c);
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                                  (pmVar7,(undefined1 *)
                                          ((long)&((_Var10._M_cur)->
                                                  super__Hash_node_value<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ._M_storage._M_storage + 8));
                        pvVar8 = Graph::reverse_graph(((DynamicPartialIndex *)this_01)->graph_);
                        pvVar9 = Graph::graph(((DynamicPartialIndex *)this_01)->graph_);
                        iVar6 = std::
                                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                ::find(&this_00->_M_h,&uStack_9c);
                        if (iVar6.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                            ._M_cur != (__node_type *)0x0) {
                          update_remove((DynamicPartialIndex *)this_01,vStack_a0,vStack_a4,pvVar8,
                                        pvVar9,(vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                *)((long)iVar6.
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                                  ._M_cur + 0x10));
                          goto LAB_0010ac94;
                        }
                      }
                    }
                  }
                }
              }
              else if (iVar6.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                       ._M_cur == (__node_type *)0x0) {
                iVar6 = std::
                        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        ::find(&(((DynamicPartialIndex *)this_01)->parent_->D1_).succ_temp_._M_h,
                               &uStack_9c);
                if (iVar6.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                    ._M_cur == (__node_type *)0x0) {
                  dVar5 = Graph::num_vertices(((DynamicPartialIndex *)this_01)->graph_);
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                            (&vStack_90,(ulong)dVar5,"?21DynamicScalableKReach",&aStack_a5);
                  pmVar7 = std::__detail::
                           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)p_Stack_98,&uStack_9c);
                  puVar3 = (pmVar7->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  puVar4 = (pmVar7->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_end_of_storage;
                  (pmVar7->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start =
                       vStack_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
                  (pmVar7->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish =
                       vStack_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  (pmVar7->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_end_of_storage =
                       vStack_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
                  vStack_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  vStack_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  vStack_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  if ((puVar3 != (pointer)0x0) &&
                     (operator_delete(puVar3,(long)puVar4 - (long)puVar3),
                     vStack_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                    operator_delete(vStack_90.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)vStack_90.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)vStack_90.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  uVar19 = uStack_9c;
                  pvVar8 = Graph::graph(((DynamicPartialIndex *)this_01)->graph_);
                  iVar6 = std::
                          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          ::find(p_Stack_98,&uStack_9c);
                  if (iVar6.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                      ._M_cur != (__node_type *)0x0) {
                    construct_bfs((DynamicPartialIndex *)this_01,uVar19,pvVar8,
                                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  ((long)iVar6.
                                         super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                         ._M_cur + 0x10));
                    dVar5 = Graph::num_vertices(((DynamicPartialIndex *)this_01)->graph_);
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                              (&vStack_90,(ulong)dVar5,"?21DynamicScalableKReach",&aStack_a5);
                    pmVar7 = std::__detail::
                             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                           *)this_00,&uStack_9c);
LAB_0010ac0d:
                    puVar3 = (pmVar7->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start;
                    puVar4 = (pmVar7->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
                    (pmVar7->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start =
                         vStack_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                    (pmVar7->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish =
                         vStack_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                    (pmVar7->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_end_of_storage =
                         vStack_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    vStack_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    vStack_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    vStack_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    if ((puVar3 != (pointer)0x0) &&
                       (operator_delete(puVar3,(long)puVar4 - (long)puVar3),
                       vStack_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
                      operator_delete(vStack_90.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)vStack_90.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)vStack_90.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    uVar19 = uStack_9c;
                    pvVar8 = Graph::reverse_graph(((DynamicPartialIndex *)this_01)->graph_);
                    iVar6 = std::
                            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            ::find(&this_00->_M_h,&uStack_9c);
                    if (iVar6.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                        ._M_cur != (__node_type *)0x0) {
                      construct_bfs((DynamicPartialIndex *)this_01,uVar19,pvVar8,
                                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    ((long)iVar6.
                                           super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                           ._M_cur + 0x10));
LAB_0010ac94:
                      p_Var18 = p_Stack_70;
                      std::
                      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::_M_erase(p_Stack_70,&uStack_9c);
                      std::
                      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::_M_erase(this_03,&uStack_9c);
                      update_cover((DynamicPartialIndex *)this_01,uStack_9c);
                      goto LAB_0010acbb;
                    }
                  }
                }
                else {
                  iVar6 = std::
                          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          ::find(&(((DynamicPartialIndex *)this_01)->parent_->D1_).succ_temp_._M_h,
                                 &uStack_9c);
                  p_Var18 = p_Stack_98;
                  if (iVar6.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                      ._M_cur != (__node_type *)0x0) {
                    pmVar7 = std::__detail::
                             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                           *)p_Stack_98,&uStack_9c);
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                              (pmVar7,(long)iVar6.
                                            super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                            ._M_cur + 0x10);
                    pvVar8 = Graph::graph(((DynamicPartialIndex *)this_01)->graph_);
                    pvVar9 = Graph::reverse_graph(((DynamicPartialIndex *)this_01)->graph_);
                    iVar6 = std::
                            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            ::find(p_Var18,&uStack_9c);
                    if (iVar6.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                        ._M_cur != (__node_type *)0x0) {
                      update_remove((DynamicPartialIndex *)this_01,vStack_a4,vStack_a0,pvVar8,pvVar9
                                    ,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     ((long)iVar6.
                                            super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                            ._M_cur + 0x10));
                      _Var10._M_cur =
                           (__node_type *)
                           std::
                           _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           ::find(&(((DynamicPartialIndex *)this_01)->parent_->D1_).pred_temp_._M_h,
                                  &uStack_9c);
                      this_03 = p_Stack_78;
                      goto joined_r0x0010a5dd;
                    }
                  }
                }
              }
              else {
                iVar6 = std::
                        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        ::find(p_Var18,&uStack_9c);
                if (iVar6.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                    ._M_cur != (__node_type *)0x0) {
                  pmVar7 = std::__detail::
                           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)p_Stack_98,&uStack_9c);
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                            (pmVar7,(long)iVar6.
                                          super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                          ._M_cur + 0x10);
                  for (p_Var17 = (((DynamicPartialIndex *)this_01)->parent_->D1_).succ_temp_._M_h.
                                 _M_before_begin._M_nxt; p_Var17 != (_Hash_node_base *)0x0;
                      p_Var17 = p_Var17->_M_nxt) {
                    iVar6 = std::
                            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            ::find(p_Stack_98,&uStack_9c);
                    if (iVar6.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                        ._M_cur == (__node_type *)0x0) goto LAB_0010ad04;
                    uVar19 = *(uint *)&p_Var17[1]._M_nxt;
                    if ((ulong)(*(long *)((long)iVar6.
                                                super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                                ._M_cur + 0x18) -
                               *(long *)((long)iVar6.
                                               super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                               ._M_cur + 0x10)) <= (ulong)uVar19) goto LAB_0010ad23;
                    if (*(char *)(*(long *)((long)iVar6.
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                                  ._M_cur + 0x10) + (ulong)uVar19) != '?') {
                      pvVar8 = Graph::graph(((DynamicPartialIndex *)this_01)->graph_);
                      iVar6 = std::
                              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                              ::find(p_Stack_98,&uStack_9c);
                      if (iVar6.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                          ._M_cur == (__node_type *)0x0) goto LAB_0010ad04;
                      resume_bfs((DynamicPartialIndex *)this_01,uVar19,pvVar8,
                                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 ((long)iVar6.
                                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                        ._M_cur + 0x10));
                    }
                  }
                  pvVar8 = Graph::graph(((DynamicPartialIndex *)this_01)->graph_);
                  pvVar9 = Graph::reverse_graph(((DynamicPartialIndex *)this_01)->graph_);
                  iVar6 = std::
                          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          ::find(p_Stack_98,&uStack_9c);
                  if (iVar6.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                      ._M_cur != (__node_type *)0x0) {
                    update_remove((DynamicPartialIndex *)this_01,vStack_a4,vStack_a0,pvVar8,pvVar9,
                                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  ((long)iVar6.
                                         super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                         ._M_cur + 0x10));
                    iVar6 = std::
                            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            ::find(p_Stack_78,&uStack_9c);
                    if (iVar6.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                        ._M_cur != (__node_type *)0x0) {
                      pmVar7 = std::__detail::
                               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                             *)this_00,&uStack_9c);
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                                (pmVar7,(long)iVar6.
                                              super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                              ._M_cur + 0x10);
                      for (p_Var17 = (((DynamicPartialIndex *)this_01)->parent_->D1_).succ_temp_.
                                     _M_h._M_before_begin._M_nxt; p_Var17 != (_Hash_node_base *)0x0;
                          p_Var17 = p_Var17->_M_nxt) {
                        iVar6 = std::
                                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                ::find(&this_00->_M_h,&uStack_9c);
                        if (iVar6.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                            ._M_cur == (__node_type *)0x0) goto LAB_0010ad04;
                        uVar19 = *(uint *)&p_Var17[1]._M_nxt;
                        if ((ulong)(*(long *)((long)iVar6.
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                                  ._M_cur + 0x18) -
                                   *(long *)((long)iVar6.
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                                  ._M_cur + 0x10)) <= (ulong)uVar19)
                        goto LAB_0010ad23;
                        if (*(char *)(*(long *)((long)iVar6.
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                                  ._M_cur + 0x10) + (ulong)uVar19) != '?') {
                          pvVar8 = Graph::reverse_graph(((DynamicPartialIndex *)this_01)->graph_);
                          iVar6 = std::
                                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                  ::find(&this_00->_M_h,&uStack_9c);
                          if (iVar6.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                              ._M_cur == (__node_type *)0x0) goto LAB_0010ad04;
                          resume_bfs((DynamicPartialIndex *)this_01,uVar19,pvVar8,
                                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     ((long)iVar6.
                                            super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                            ._M_cur + 0x10));
                        }
                      }
LAB_0010a9f1:
                      pvVar8 = Graph::reverse_graph(((DynamicPartialIndex *)this_01)->graph_);
                      pvVar9 = Graph::graph(((DynamicPartialIndex *)this_01)->graph_);
                      iVar6 = std::
                              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                              ::find(&this_00->_M_h,&uStack_9c);
                      if (iVar6.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                          ._M_cur != (__node_type *)0x0) {
                        update_remove((DynamicPartialIndex *)this_01,vStack_a0,vStack_a4,pvVar8,
                                      pvVar9,(vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)((long)iVar6.
                                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                                  ._M_cur + 0x10));
                        this_03 = p_Stack_78;
                        goto LAB_0010ac94;
                      }
                    }
                  }
                }
              }
LAB_0010ad04:
              std::__throw_out_of_range("_Map_base::at");
LAB_0010ad23:
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
            }
            std::
            priority_queue<std::pair<unsigned_int,unsigned_int>,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::less<std::pair<unsigned_int,unsigned_int>>>
            ::emplace<unsigned_int&,unsigned_int&>
                      ((priority_queue<std::pair<unsigned_int,unsigned_int>,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::less<std::pair<unsigned_int,unsigned_int>>>
                        *)((DynamicPartialIndex *)this_01)->quedeg_,puVar2 + uVar14,&uStack_9c);
          }
        }
LAB_0010acbb:
        this_02 = ((DynamicPartialIndex *)this_01)->quedeg_;
        ppVar12 = (this_02->c).
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar13 = (this_02->c).
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (ppVar12 == ppVar13) {
          return;
        }
      } while ((((DynamicPartialIndex *)this_01)->succ_)._M_h._M_element_count !=
               (ulong)((DynamicPartialIndex *)this_01)->budget_);
    }
    if (ppVar12 != ppVar13) {
      do {
        std::
        priority_queue<std::pair<unsigned_int,_unsigned_int>,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>_>
        ::pop(this_02);
        this_02 = ((DynamicPartialIndex *)this_01)->quedeg_;
      } while ((this_02->c).
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               (this_02->c).
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  return;
}

Assistant:

void DynamicScalableKReach::DynamicPartialIndex::update_cover(vertex_t v) {
    for (vertex_t j = 0; j < graph_.num_vertices(); ++j) {
        if ((succ_.at(v).at(j) != INF8 || pred_.at(v).at(j) != INF8) &&
            degree_.at(j) > 0) {
            cover(j);
        }
    }
}